

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reconinter.c
# Opt level: O3

void av1_setup_build_prediction_by_left_pred
               (MACROBLOCKD *xd,int rel_mi_row,uint8_t left_mi_height,MB_MODE_INFO *left_mbmi,
               build_prediction_ctxt *ctxt,int num_planes)

{
  BLOCK_SIZE BVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  uint8_t **ppuVar5;
  int *piVar6;
  int *piVar7;
  int *piVar8;
  uint8_t *puVar9;
  AV1_COMMON *pAVar10;
  bool bVar11;
  bool bVar12;
  byte bVar13;
  ulong uVar14;
  int mi_row;
  long lVar15;
  RefCntBuffer *pRVar16;
  int *piVar17;
  ulong uVar18;
  scale_factors *sf;
  uint uVar19;
  
  BVar1 = left_mbmi->bsize;
  mi_row = xd->mi_row + rel_mi_row;
  left_mbmi->ref_frame[1] = -1;
  (left_mbmi->interinter_comp).type = '\0';
  if (num_planes < 1) {
    bVar11 = false;
  }
  else {
    uVar14 = 3;
    if (BLOCK_8X8 < BVar1) {
      uVar14 = (ulong)BVar1;
    }
    ppuVar5 = ctxt->tmp_buf;
    piVar6 = ctxt->tmp_width;
    piVar7 = ctxt->tmp_height;
    piVar8 = ctxt->tmp_stride;
    piVar17 = &xd->plane[0].dst.stride;
    uVar18 = 0;
    do {
      puVar9 = ppuVar5[uVar18];
      iVar2 = piVar6[uVar18];
      uVar19 = (uint)((0x20005UL >> (uVar14 & 0x3f) & 1) != 0);
      if (piVar17[-8] == 0) {
        uVar19 = 0;
      }
      iVar3 = piVar7[uVar18];
      iVar4 = piVar8[uVar18];
      ((buf_2d *)(piVar17 + -6))->buf =
           puVar9 + (long)((int)((~uVar19 & rel_mi_row) << 2) >> ((byte)piVar17[-8] & 0x1f)) *
                    (long)iVar4;
      *(uint8_t **)(piVar17 + -4) = puVar9;
      piVar17[-2] = iVar2;
      piVar17[-1] = iVar3;
      *piVar17 = iVar4;
      uVar18 = uVar18 + 1;
      piVar17 = piVar17 + 0x28c;
    } while ((uint)num_planes != uVar18);
    bVar11 = '\0' < left_mbmi->ref_frame[1];
  }
  bVar13 = 1;
  lVar15 = 0;
  do {
    if ((byte)(left_mbmi->ref_frame[lVar15] - 1U) < 8) {
      pAVar10 = ctxt->cm;
      iVar2 = pAVar10->remapped_ref_idx[(byte)left_mbmi->ref_frame[lVar15] - 1];
      if (iVar2 == -1) {
        pRVar16 = (RefCntBuffer *)0x0;
      }
      else {
        pRVar16 = pAVar10->ref_frame_map[iVar2];
      }
      sf = (scale_factors *)0x0;
      if (iVar2 != -1) {
        sf = pAVar10->ref_scale_factors + iVar2;
      }
    }
    else {
      pRVar16 = (RefCntBuffer *)0x0;
      sf = (scale_factors *)0x0;
    }
    xd->block_ref_scale_factors[lVar15] = sf;
    if ((sf->x_scale_fp == -1) || (sf->y_scale_fp == -1)) {
      aom_internal_error(xd->error_info,AOM_CODEC_UNSUP_BITSTREAM,
                         "Reference frame has invalid dimensions");
    }
    av1_setup_pre_planes(xd,(int)lVar15,&pRVar16->buf,mi_row,xd->mi_col,sf,num_planes);
    lVar15 = 1;
    bVar12 = (bool)(bVar13 & bVar11);
    bVar13 = 0;
  } while (bVar12);
  xd->mb_to_top_edge = mi_row * -0x20;
  xd->mb_to_bottom_edge =
       ((uint)xd->height - ((uint)left_mi_height + rel_mi_row)) * 0x20 + ctxt->mb_to_far_edge;
  return;
}

Assistant:

void av1_setup_build_prediction_by_left_pred(MACROBLOCKD *xd, int rel_mi_row,
                                             uint8_t left_mi_height,
                                             MB_MODE_INFO *left_mbmi,
                                             struct build_prediction_ctxt *ctxt,
                                             const int num_planes) {
  const BLOCK_SIZE l_bsize = AOMMAX(BLOCK_8X8, left_mbmi->bsize);
  const int left_mi_row = xd->mi_row + rel_mi_row;

  modify_neighbor_predictor_for_obmc(left_mbmi);

  for (int j = 0; j < num_planes; ++j) {
    struct macroblockd_plane *const pd = &xd->plane[j];
    setup_pred_plane(&pd->dst, l_bsize, ctxt->tmp_buf[j], ctxt->tmp_width[j],
                     ctxt->tmp_height[j], ctxt->tmp_stride[j], rel_mi_row, 0,
                     NULL, pd->subsampling_x, pd->subsampling_y);
  }

  const int num_refs = 1 + has_second_ref(left_mbmi);

  for (int ref = 0; ref < num_refs; ++ref) {
    const MV_REFERENCE_FRAME frame = left_mbmi->ref_frame[ref];

    const RefCntBuffer *const ref_buf = get_ref_frame_buf(ctxt->cm, frame);
    const struct scale_factors *const ref_scale_factors =
        get_ref_scale_factors_const(ctxt->cm, frame);

    xd->block_ref_scale_factors[ref] = ref_scale_factors;
    if ((!av1_is_valid_scale(ref_scale_factors)))
      aom_internal_error(xd->error_info, AOM_CODEC_UNSUP_BITSTREAM,
                         "Reference frame has invalid dimensions");
    av1_setup_pre_planes(xd, ref, &ref_buf->buf, left_mi_row, xd->mi_col,
                         ref_scale_factors, num_planes);
  }

  xd->mb_to_top_edge = GET_MV_SUBPEL(MI_SIZE * (-left_mi_row));
  xd->mb_to_bottom_edge =
      ctxt->mb_to_far_edge +
      GET_MV_SUBPEL((xd->height - rel_mi_row - left_mi_height) * MI_SIZE);
}